

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

void __thiscall OpenMD::RigidBody::addAtom(RigidBody *this,Atom *at,AtomStamp *ats)

{
  bool bVar1;
  RectMatrix<double,_3U,_3U> *this_00;
  undefined1 auVar2 [16];
  Vector3d euler;
  Vector3d coords;
  RotMat3x3d Atmp;
  RotMat3x3d identMat;
  Atom *local_f0;
  undefined1 local_e8 [16];
  double local_d8;
  Vector<double,_3U> local_c8;
  RectMatrix<double,_3U,_3U> local_b0;
  RectMatrix<double,_3U,_3U> local_68;
  
  local_f0 = at;
  Vector<double,_3U>::Vector(&local_c8);
  Vector<double,_3U>::Vector((Vector<double,_3U> *)local_e8);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::push_back(&this->atoms_,&local_f0);
  if (ats->havePos_ == false) {
    std::__cxx11::string::string((string *)&local_68,(string *)&(ats->Type).data_);
    snprintf(painCave.errMsg,2000,
             "RigidBody error.\n\tAtom %s does not have a position specified.\n\tThis means RigidBody cannot set up reference coordinates.\n"
             ,local_68.data_[0][0]);
    std::__cxx11::string::~string((string *)&local_68);
    painCave.isFatal = 1;
    simError();
  }
  local_c8.data_[0] = (ats->position_).super_Vector<double,_3U>.data_[0];
  local_c8.data_[1] = (ats->position_).super_Vector<double,_3U>.data_[1];
  local_c8.data_[2] = (ats->position_).super_Vector<double,_3U>.data_[2];
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (&this->refCoords_,(value_type *)&local_c8);
  SquareMatrix<double,_3>::identity();
  RectMatrix<double,_3U,_3U>::operator=(&local_68,&local_b0);
  bVar1 = Atom::isDirectional(local_f0);
  if (bVar1) {
    if (ats->haveOrt_ == false) {
      std::__cxx11::string::string((string *)&local_b0,(string *)&(ats->Type).data_);
      snprintf(painCave.errMsg,2000,
               "RigidBody error.\n\tAtom %s does not have an orientation specified.\n\tThis means RigidBody cannot set up reference orientations.\n"
               ,local_b0.data_[0][0]);
      std::__cxx11::string::~string((string *)&local_b0);
      painCave.isFatal = 1;
      simError();
    }
    auVar2._0_8_ = (ats->orientation_).super_Vector<double,_3U>.data_[0] * 3.141592653589793;
    auVar2._8_8_ = (ats->orientation_).super_Vector<double,_3U>.data_[1] * 3.141592653589793;
    local_e8 = divpd(auVar2,_DAT_001ce380);
    local_d8 = ((ats->orientation_).super_Vector<double,_3U>.data_[2] * 3.141592653589793) / 180.0;
    this_00 = &local_b0;
    SquareMatrix3<double>::SquareMatrix3
              ((SquareMatrix3<double> *)this_00,(Vector3<double> *)local_e8);
  }
  else {
    this_00 = &local_68;
  }
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  push_back(&this->refOrients_,(value_type *)this_00);
  return;
}

Assistant:

void RigidBody::addAtom(Atom* at, AtomStamp* ats) {
    Vector3d coords;
    Vector3d euler;

    atoms_.push_back(at);

    if (!ats->havePosition()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RigidBody error.\n"
               "\tAtom %s does not have a position specified.\n"
               "\tThis means RigidBody cannot set up reference coordinates.\n",
               ats->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    coords[0] = ats->getPosX();
    coords[1] = ats->getPosY();
    coords[2] = ats->getPosZ();

    refCoords_.push_back(coords);

    RotMat3x3d identMat = RotMat3x3d::identity();

    if (at->isDirectional()) {
      if (!ats->haveOrientation()) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "RigidBody error.\n"
            "\tAtom %s does not have an orientation specified.\n"
            "\tThis means RigidBody cannot set up reference orientations.\n",
            ats->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }

      euler[0] = ats->getEulerPhi() * Constants::PI / 180.0;
      euler[1] = ats->getEulerTheta() * Constants::PI / 180.0;
      euler[2] = ats->getEulerPsi() * Constants::PI / 180.0;

      RotMat3x3d Atmp(euler);
      refOrients_.push_back(Atmp);

    } else {
      refOrients_.push_back(identMat);
    }
  }